

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

void os_strsc(char *p)

{
  char *in_RDI;
  size_t copy_len;
  size_t local_10;
  
  if (in_RDI != (char *)0x0) {
    local_10 = strlen(in_RDI);
    if (0x86 < local_10) {
      local_10 = 0x86;
    }
    memcpy(S_scorebuf,in_RDI,local_10);
    S_scorebuf[local_10] = '\0';
  }
  osgen_update_stat_right();
  return;
}

Assistant:

void os_strsc(const char *p)
{
    size_t copy_len;

    /* copy the score, if a value was given */
    if (p != 0)
    {
        /* limit the copying length to our buffer size */
        copy_len = strlen(p);
        if (copy_len > sizeof(S_scorebuf) - 1)
            copy_len = sizeof(S_scorebuf) - 1;
        
        /* copy the text and null-terminate it */
        memcpy(S_scorebuf, p, copy_len);
        S_scorebuf[copy_len] = '\0';
    }

    /* update the statusline window */
    osgen_update_stat_right();
}